

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

ILabel * __thiscall iDynTree::Visualizer::getLabel(Visualizer *this,string *labelName)

{
  return &(this->pimpl->m_invalidLabel).super_ILabel;
}

Assistant:

ILabel &Visualizer::getLabel(const std::string &labelName)
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !this->pimpl->m_isInitialized )
    {
        init();
    }
    Label& requestedLabel =  this->pimpl->m_labels[labelName];
    if (!requestedLabel.initialized())
    {
        requestedLabel.init(this->pimpl->m_irrSmgr);
    }
    return requestedLabel;
#else
    return this->pimpl->m_invalidLabel;
#endif
}